

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O3

drwav_uint64 drwav_read_s16__ieee(drwav *pWav,drwav_uint64 samplesToRead,drwav_int16 *pBufferOut)

{
  float fVar1;
  double dVar2;
  size_t i;
  drwav_uint64 dVar3;
  drwav_uint64 dVar4;
  ushort uVar5;
  ulong samplesToRead_00;
  drwav_uint64 dVar6;
  float fVar7;
  double dVar8;
  uchar sampleData [4096];
  double local_1038 [513];
  
  if (samplesToRead == 0) {
    dVar6 = 0;
  }
  else {
    dVar6 = 0;
    do {
      samplesToRead_00 = (ulong)(0x1000 / pWav->bytesPerSample);
      if (samplesToRead < samplesToRead_00) {
        samplesToRead_00 = samplesToRead;
      }
      dVar3 = drwav_read(pWav,samplesToRead_00,local_1038);
      if (dVar3 == 0) {
        return dVar6;
      }
      if (pWav->bytesPerSample == 4) {
        dVar4 = 0;
        do {
          fVar1 = *(float *)((long)local_1038 + dVar4 * 4);
          uVar5 = 0x8000;
          if (-1.0 <= fVar1) {
            fVar7 = 1.0;
            if (fVar1 <= 1.0) {
              fVar7 = fVar1;
            }
            uVar5 = (ushort)(int)((fVar7 + 1.0) * 32767.5) ^ 0x8000;
          }
          pBufferOut[dVar4] = uVar5;
          dVar4 = dVar4 + 1;
        } while (dVar3 != dVar4);
      }
      else if (pWav->bytesPerSample == 8) {
        dVar4 = 0;
        do {
          dVar2 = local_1038[dVar4];
          uVar5 = 0x8000;
          if (-1.0 <= dVar2) {
            dVar8 = 1.0;
            if (dVar2 <= 1.0) {
              dVar8 = dVar2;
            }
            uVar5 = (ushort)(int)((dVar8 + 1.0) * 32767.5) ^ 0x8000;
          }
          pBufferOut[dVar4] = uVar5;
          dVar4 = dVar4 + 1;
        } while (dVar3 != dVar4);
      }
      else {
        memset(pBufferOut,0,dVar3 * 2);
      }
      pBufferOut = pBufferOut + dVar3;
      dVar6 = dVar6 + dVar3;
      samplesToRead = samplesToRead - dVar3;
    } while (samplesToRead != 0);
  }
  return dVar6;
}

Assistant:

drwav_uint64 drwav_read_s16__ieee(drwav* pWav, drwav_uint64 samplesToRead, drwav_int16* pBufferOut) {
    drwav_uint64 totalSamplesRead = 0;
    unsigned char sampleData[4096];
    while (samplesToRead > 0) {
        drwav_uint64 samplesRead =
            drwav_read(pWav, drwav_min(samplesToRead, sizeof(sampleData) / pWav->bytesPerSample), sampleData);
        if (samplesRead == 0) {
            break;
        }

        drwav__ieee_to_s16(pBufferOut, sampleData, (size_t)samplesRead, pWav->bytesPerSample);

        pBufferOut += samplesRead;
        samplesToRead -= samplesRead;
        totalSamplesRead += samplesRead;
    }

    return totalSamplesRead;
}